

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_utils.cpp
# Opt level: O2

bool FileSysUtilsGetCanonicalPath(string *path,string *canonical)

{
  char *pcVar1;
  char buf [4096];
  char acStack_1018 [4104];
  
  pcVar1 = realpath((path->_M_dataplus)._M_p,acStack_1018);
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::assign((char *)canonical);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool FileSysUtilsGetCanonicalPath(const std::string& path, std::string& canonical) {
    char buf[PATH_MAX];
    if (nullptr != realpath(path.c_str(), buf)) {
        canonical = buf;
        return true;
    }
    return false;
}